

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O1

int LowMC_test_vector_192_192_4_2(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t local_58 [32];
  uint8_t local_38 [32];
  uint8_t local_18 [24];
  
  local_18[0] = 0x81;
  local_18[1] = 0xb8;
  local_18[2] = ']';
  local_18[3] = 0xfe;
  local_18[4] = '@';
  local_18[5] = 0xf6;
  local_18[6] = '\x12';
  local_18[7] = '\'';
  local_18[8] = 'Z';
  local_18[9] = 0xa3;
  local_18[10] = 0xf9;
  local_18[0xb] = '\x19';
  local_18[0xc] = 0x91;
  local_18[0xd] = '9';
  local_18[0xe] = 0xeb;
  local_18[0xf] = 0xaa;
  local_18[0x10] = 0xe8;
  local_18[0x11] = 0xdf;
  local_18[0x12] = 0xf8;
  local_18[0x13] = '6';
  local_18[0x14] = 'o';
  local_18[0x15] = '-';
  local_18[0x16] = 0xd3;
  local_18[0x17] = 'N';
  local_38[0] = 0xb8;
  local_38[1] = 'e';
  local_38[2] = 0xcc;
  local_38[3] = 0xf3;
  local_38[4] = 0xfc;
  local_38[5] = 0xda;
  local_38[6] = 0x8d;
  local_38[7] = 0xdb;
  local_38[8] = 0xed;
  local_38[9] = 'R';
  local_38[10] = '}';
  local_38[0xb] = 0xc3;
  local_38[0xc] = 'M';
  local_38[0xd] = 0xd4;
  local_38[0xe] = '\x15';
  local_38[0xf] = '\r';
  local_38[0x10] = 'J';
  local_38[0x11] = 'H';
  local_38[0x12] = '-';
  local_38[0x13] = 0xcb;
  local_38[0x14] = 0xf7;
  local_38[0x15] = 0xe9;
  local_38[0x16] = 'd';
  local_38[0x17] = '<';
  local_58[0] = 0x95;
  local_58[1] = 0xef;
  local_58[2] = 0x9e;
  local_58[3] = 0xd7;
  local_58[4] = 0xc3;
  local_58[5] = 'x';
  local_58[6] = 'r';
  local_58[7] = 0xa7;
  local_58[8] = 0xb4;
  local_58[9] = '`';
  local_58[10] = '*';
  local_58[0xb] = '?';
  local_58[0xc] = 0xa9;
  local_58[0xd] = 0xc4;
  local_58[0xe] = 'n';
  local_58[0xf] = 0xbc;
  local_58[0x10] = 0xb8;
  local_58[0x11] = 'B';
  local_58[0x12] = 'T';
  local_58[0x13] = 0xed;
  local_58[0x14] = '\x0e';
  local_58[0x15] = 'D';
  local_58[0x16] = 0xee;
  local_58[0x17] = 0x9f;
  iVar1 = lowmc_enc(&parameters_192_192_4,local_18,local_38,local_58);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_2(void) {
  const uint8_t key[24] = {
      0x81, 0xb8, 0x5d, 0xfe, 0x40, 0xf6, 0x12, 0x27, 0x5a, 0xa3, 0xf9, 0x19,
      0x91, 0x39, 0xeb, 0xaa, 0xe8, 0xdf, 0xf8, 0x36, 0x6f, 0x2d, 0xd3, 0x4e,
  };
  const uint8_t plaintext[24] = {
      0xb8, 0x65, 0xcc, 0xf3, 0xfc, 0xda, 0x8d, 0xdb, 0xed, 0x52, 0x7d, 0xc3,
      0x4d, 0xd4, 0x15, 0xd,  0x4a, 0x48, 0x2d, 0xcb, 0xf7, 0xe9, 0x64, 0x3c,
  };
  const uint8_t ciphertext_expected[24] = {
      0x95, 0xef, 0x9e, 0xd7, 0xc3, 0x78, 0x72, 0xa7, 0xb4, 0x60, 0x2a, 0x3f,
      0xa9, 0xc4, 0x6e, 0xbc, 0xb8, 0x42, 0x54, 0xed, 0xe,  0x44, 0xee, 0x9f,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}